

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

bool __thiscall spvtools::opt::analysis::CompositeConstant::IsZero(CompositeConstant *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  
  iVar4 = (*(this->super_Constant)._vptr_Constant[0x18])();
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar4))[1];
  puVar2 = *(undefined8 **)CONCAT44(extraout_var,iVar4);
  do {
    puVar5 = puVar2;
    if (puVar5 == puVar1) break;
    cVar3 = (**(code **)(*(long *)*puVar5 + 0xb8))();
    puVar2 = puVar5 + 1;
  } while (cVar3 != '\0');
  return puVar5 == puVar1;
}

Assistant:

bool IsZero() const override {
    for (const Constant* c : GetComponents()) {
      if (!c->IsZero()) {
        return false;
      }
    }
    return true;
  }